

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void finalize_source(parser *p)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long in_RDI;
  bool bVar4;
  int f;
  io_buf *in_stack_ffffffffffffffe0;
  
  iVar2 = fileno(_stdin);
  while( true ) {
    bVar1 = v_array<int>::empty((v_array<int> *)(*(long *)(in_RDI + 0x1e8) + 0x30));
    bVar4 = false;
    if (!bVar1) {
      iVar3 = v_array<int>::last((v_array<int> *)(*(long *)(in_RDI + 0x1e8) + 0x30));
      bVar4 = iVar3 == iVar2;
    }
    if (!bVar4) break;
    v_array<int>::pop((v_array<int> *)(*(long *)(in_RDI + 0x1e8) + 0x30));
  }
  io_buf::close_files(in_stack_ffffffffffffffe0);
  if (*(long **)(in_RDI + 0x1e8) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x1e8) + 0x18))();
  }
  *(undefined8 *)(in_RDI + 0x1e8) = 0;
  io_buf::close_files(in_stack_ffffffffffffffe0);
  if (*(long **)(in_RDI + 0x210) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x210) + 0x18))();
  }
  *(undefined8 *)(in_RDI + 0x210) = 0;
  return;
}

Assistant:

void finalize_source(parser* p)
{
#ifdef _WIN32
  int f = _fileno(stdin);
#else
  int f = fileno(stdin);
#endif
  while (!p->input->files.empty() && p->input->files.last() == f) p->input->files.pop();
  p->input->close_files();

  delete p->input;
  p->input = nullptr;
  p->output->close_files();
  delete p->output;
  p->output = nullptr;
}